

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O0

int32 * UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix
                  (ArenaAllocator *allocator,Char *pat,CharCount patLen,int skip)

{
  Char *pCVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  bool bVar3;
  uint local_104;
  CharCount j_2;
  int32 s;
  CharCount j_1;
  CharCount l;
  CharCount j;
  TrackAllocData local_e0;
  int *local_b8;
  int32 *goodSuffix;
  code *pcStack_a8;
  CharCount q_1;
  undefined8 local_a0;
  TrackAllocData local_98;
  int *local_70;
  int32 *revPrefix;
  CharCount q;
  int32 k;
  undefined8 local_58;
  TrackAllocData local_50;
  int *local_28;
  int32 *prefix;
  int skip_local;
  CharCount patLen_local;
  Char *pat_local;
  ArenaAllocator *allocator_local;
  
  prefix._0_4_ = skip;
  prefix._4_4_ = patLen;
  _skip_local = pat;
  pat_local = (Char *)allocator;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&int::typeinfo,0,(ulong)patLen,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
             ,0x56);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(&allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                          &local_50);
  _q = Memory::ArenaAllocator::Alloc;
  local_58 = 0;
  local_28 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                       ((Memory *)pAVar2,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)prefix._4_4_);
  pCVar1 = pat_local;
  *local_28 = 0;
  revPrefix._4_4_ = 0;
  for (revPrefix._0_4_ = 1; (uint)revPrefix < prefix._4_4_; revPrefix._0_4_ = (uint)revPrefix + 1) {
    while( true ) {
      bVar3 = false;
      if (0 < revPrefix._4_4_) {
        bVar3 = _skip_local[revPrefix._4_4_ * (int)prefix] !=
                _skip_local[(uint)revPrefix * (int)prefix];
      }
      if (!bVar3) break;
      revPrefix._4_4_ = local_28[revPrefix._4_4_ + -1];
    }
    if (_skip_local[revPrefix._4_4_ * (int)prefix] == _skip_local[(uint)revPrefix * (int)prefix]) {
      revPrefix._4_4_ = revPrefix._4_4_ + 1;
    }
    local_28[(uint)revPrefix] = revPrefix._4_4_;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&int::typeinfo,0,(ulong)prefix._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
             ,99);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pCVar1,&local_98);
  pcStack_a8 = Memory::ArenaAllocator::Alloc;
  local_a0 = 0;
  local_70 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                       ((Memory *)pAVar2,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)prefix._4_4_);
  pCVar1 = pat_local;
  *local_70 = 0;
  revPrefix._4_4_ = 0;
  for (goodSuffix._4_4_ = 1; goodSuffix._4_4_ < prefix._4_4_;
      goodSuffix._4_4_ = goodSuffix._4_4_ + 1) {
    while( true ) {
      bVar3 = false;
      if (0 < revPrefix._4_4_) {
        bVar3 = _skip_local[((prefix._4_4_ - revPrefix._4_4_) + -1) * (int)prefix] !=
                _skip_local[((prefix._4_4_ - goodSuffix._4_4_) + -1) * (int)prefix];
      }
      if (!bVar3) break;
      revPrefix._4_4_ = local_70[revPrefix._4_4_ + -1];
    }
    if (_skip_local[((prefix._4_4_ - revPrefix._4_4_) + -1) * (int)prefix] ==
        _skip_local[((prefix._4_4_ - goodSuffix._4_4_) + -1) * (int)prefix]) {
      revPrefix._4_4_ = revPrefix._4_4_ + 1;
    }
    local_70[goodSuffix._4_4_] = revPrefix._4_4_;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_e0,(type_info *)&int::typeinfo,0,(ulong)(prefix._4_4_ + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
             ,0x70);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pCVar1,&local_e0);
  local_b8 = Memory::AllocateArray<Memory::ArenaAllocator,int,false>
                       ((Memory *)pAVar2,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)(prefix._4_4_ + 1));
  for (j_1 = 0; j_1 <= prefix._4_4_; j_1 = j_1 + 1) {
    local_b8[j_1] = prefix._4_4_ - local_28[prefix._4_4_ - 1];
  }
  for (s = 1; (uint)s <= prefix._4_4_; s = s + 1) {
    if (s - local_70[s - 1] < local_b8[prefix._4_4_ - local_70[s - 1]]) {
      local_b8[prefix._4_4_ - local_70[s - 1]] = s - local_70[s - 1];
    }
  }
  for (local_104 = 0; local_104 < prefix._4_4_; local_104 = local_104 + 1) {
    local_b8[local_104] = local_b8[local_104 + 1];
  }
  Memory::DeleteArray<Memory::ArenaAllocator,int>
            ((AllocatorType *)pat_local,(ulong)prefix._4_4_,local_28);
  Memory::DeleteArray<Memory::ArenaAllocator,int>
            ((AllocatorType *)pat_local,(ulong)prefix._4_4_,local_70);
  return local_b8;
}

Assistant:

int32 * TextbookBoyerMooreSetup<C>::GetGoodSuffix(ArenaAllocator* allocator, const Char * pat, CharCount patLen, int skip)
    {
        // pat offset q |-> longest prefix of pat which is a proper suffix of pat[0..q]
        // (thanks to equivalence classes being in canonical order we only need to look at the first
        //  character of each skip grouping in the pattern)
        int32* prefix = AnewArray(allocator, int32, patLen);
        prefix[0] = 0;
        int32 k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[k * skip] != pat[q * skip])
                k = prefix[k - 1];
            if (pat[k * skip] == pat[q * skip])
                k++;
            prefix[q] = k;
        }

        // As above, but for rev(pat)
        int32* revPrefix = AnewArray(allocator, int32, patLen);
        revPrefix[0] = 0;
        k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[(patLen - k - 1) * skip] != pat[(patLen - q - 1) * skip])
                k = revPrefix[k - 1];
            if (pat[(patLen - k - 1) * skip] == pat[(patLen - q - 1) * skip])
                k++;
            revPrefix[q] = k;
        }

        // pat prefix length l |-> least shift s.t. pat[0..l-1] is not mismatched
        int32 * goodSuffix = AnewArray(allocator, int32, patLen + 1);
        for (CharCount j = 0; j <= patLen; j++)
            goodSuffix[j] = patLen - prefix[patLen - 1];
        for (CharCount l = 1; l <= patLen; l++)
        {
            CharCount j = patLen - revPrefix[l - 1];
            int32 s = l - revPrefix[l - 1];
            if (goodSuffix[j] > s)
                goodSuffix[j] = s;
        }
        // shift above one to the left
        for (CharCount j = 0; j < patLen; j++)
            goodSuffix[j] = goodSuffix[j + 1];

        AdeleteArray(allocator, patLen, prefix);
        AdeleteArray(allocator, patLen, revPrefix);

        return goodSuffix;
    }